

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

void __thiscall
Refal2::CVariablesBuilder::warningObsoleteVariableType
          (CVariablesBuilder *this,char type,char *replacement)

{
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  char *local_20;
  char *replacement_local;
  CVariablesBuilder *pCStack_10;
  char type_local;
  CVariablesBuilder *this_local;
  
  local_20 = replacement;
  replacement_local._7_1_ = type;
  pCStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,1,type,&local_c1);
  std::operator+((char *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "variable type `");
  std::operator+(local_80,(char *)local_a0);
  std::operator+(local_60,(char *)local_80);
  std::operator+(local_40,(char *)local_60);
  CErrorsHelper::RaiseError(&this->super_CErrorsHelper,ES_Warning,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  return;
}

Assistant:

void CVariablesBuilder::warningObsoleteVariableType( char type,
	const char* replacement )
{
	CErrorsHelper::RaiseError( ES_Warning,
		"variable type `" + std::string( 1, type ) + "` is obsolete, use `"
		+ replacement + "` istead it" );
}